

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonParse(JsonParse *pParse,sqlite3_context *pCtx,char *zJson)

{
  int local_2c;
  int i;
  char *zJson_local;
  sqlite3_context *pCtx_local;
  JsonParse *pParse_local;
  
  memset(pParse,0,0x30);
  if (zJson == (char *)0x0) {
    pParse_local._4_4_ = 1;
  }
  else {
    pParse->zJson = zJson;
    local_2c = jsonParseValue(pParse,0);
    if (pParse->oom != '\0') {
      local_2c = -1;
    }
    if (0 < local_2c) {
      while (""[(byte)zJson[local_2c]] != '\0') {
        local_2c = local_2c + 1;
      }
      if (zJson[local_2c] != '\0') {
        local_2c = -1;
      }
    }
    if (local_2c < 1) {
      if (pCtx != (sqlite3_context *)0x0) {
        if (pParse->oom == '\0') {
          sqlite3_result_error(pCtx,"malformed JSON",-1);
        }
        else {
          sqlite3_result_error_nomem(pCtx);
        }
      }
      jsonParseReset(pParse);
      pParse_local._4_4_ = 1;
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

static int jsonParse(
  JsonParse *pParse,           /* Initialize and fill this JsonParse object */
  sqlite3_context *pCtx,       /* Report errors here */
  const char *zJson            /* Input JSON text to be parsed */
){
  int i;
  memset(pParse, 0, sizeof(*pParse));
  if( zJson==0 ) return 1;
  pParse->zJson = zJson;
  i = jsonParseValue(pParse, 0);
  if( pParse->oom ) i = -1;
  if( i>0 ){
    assert( pParse->iDepth==0 );
    while( fast_isspace(zJson[i]) ) i++;
    if( zJson[i] ) i = -1;
  }
  if( i<=0 ){
    if( pCtx!=0 ){
      if( pParse->oom ){
        sqlite3_result_error_nomem(pCtx);
      }else{
        sqlite3_result_error(pCtx, "malformed JSON", -1);
      }
    }
    jsonParseReset(pParse);
    return 1;
  }
  return 0;
}